

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::
PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>
::~PolymorphicMatcher
          (PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>
           *this)

{
  PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>
  *this_local;
  
  internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>::~FieldMatcher
            (&this->impl_);
  return;
}

Assistant:

explicit PolymorphicMatcher(const Impl& an_impl) : impl_(an_impl) {}